

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestMap_Test::TestBody
          (DescriptorPoolTypeResolverTest_TestMap_Test *this)

{
  AlphaNum *pAVar1;
  TypeResolver *pTVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  Field *pFVar6;
  Rep *pRVar7;
  undefined8 *puVar8;
  undefined1 *puVar9;
  char *pcVar10;
  RepeatedPtrFieldBase *pRVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  AlphaNum *in_R8;
  char *in_R9;
  pointer *__ptr;
  RepeatedPtrFieldBase *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  bool bVar12;
  Metadata MVar13;
  string_view name;
  string_view type_url;
  string_view name_00;
  string_view type_url_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  Type type;
  internal local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  undefined1 local_168 [32];
  undefined1 local_148 [48];
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  AlphaNum local_e8;
  StatusRep *local_b8;
  undefined1 local_b0 [128];
  AlphaNum *c;
  
  Type::Type((Type *)local_b0,(Arena *)0x0);
  pTVar2 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  MVar13 = proto2_unittest::TestMap::GetMetadata
                     ((TestMap *)proto2_unittest::_TestMap_default_instance_);
  local_e8.piece_._M_str = ((MVar13.descriptor)->all_names_).payload_;
  local_e8.piece_._M_len = (size_t)*(ushort *)(local_e8.piece_._M_str + 2);
  local_e8.piece_._M_str = local_e8.piece_._M_str + ~local_e8.piece_._M_len;
  local_148._0_8_ = &DAT_00000013;
  local_148._8_8_ = "type.googleapis.com";
  local_118 = (undefined1  [8])0x1;
  local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ab429;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_168,(lts_20250127 *)local_148,(AlphaNum *)local_118,&local_e8,in_R8);
  pcVar10 = local_b0;
  (*pTVar2->_vptr_TypeResolver[2])(&local_b8,pTVar2,local_168);
  local_178[0] = (internal)(local_b8 == (StatusRep *)0x1);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_b8 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_b8);
  }
  pAVar1 = (AlphaNum *)(local_168 + 0x10);
  if ((AlphaNum *)local_168._0_8_ != pAVar1) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,local_178,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType(GetTypeUrl<proto2_unittest::TestMap>(), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x144,(char *)local_148._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_118);
  }
  else {
    if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170,local_170);
    }
    name_00._M_str = pcVar10;
    name_00._M_len = (size_t)"map_int32_int32";
    pFVar6 = FindField((anon_unknown_0 *)local_b0,(Type *)&DAT_0000000f,name_00);
    if (((pFVar6 == (Field *)0x0) || ((pFVar6->field_0)._impl_.cardinality_ != 3)) ||
       ((pFVar6->field_0)._impl_.kind_ != 0xb)) {
      bVar12 = false;
    }
    else {
      bVar12 = (pFVar6->field_0)._impl_.number_ == 1;
    }
    local_118[0] = bVar12;
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar12 == false) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_148,(internal *)local_118,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_MESSAGE, \"map_int32_int32\", 1)"
                 ,"false","true",in_R9);
      in_R8 = (AlphaNum *)local_148._0_8_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x146,(char *)local_148._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
      if ((AlphaNum *)local_148._0_8_ != (AlphaNum *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      if ((long *)local_e8.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_e8.piece_._M_len + 8))();
      }
    }
    if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_110,local_110);
    }
    local_148._0_8_ = &DAT_00000013;
    local_148._8_8_ = "type.googleapis.com";
    local_118 = (undefined1  [8])0x1;
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ab429;
    local_e8.piece_._M_len = (size_t)&DAT_0000002a;
    local_e8.piece_._M_str = "proto2_unittest.TestMap.MapInt32Int32Entry";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_168,(lts_20250127 *)local_148,(AlphaNum *)local_118,&local_e8,in_R8);
    name._M_str = "map_int32_int32";
    name._M_len = 0xf;
    type_url_00._M_str = (char *)local_168._0_8_;
    type_url_00._M_len = local_168._8_8_;
    c = (AlphaNum *)local_168._0_8_;
    local_178[0] = (internal)CheckFieldTypeUrl((Type *)local_b0,name,type_url_00);
    local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((AlphaNum *)local_168._0_8_ != pAVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    if (local_178[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_148,local_178,
                 (AssertionResult *)
                 "CheckFieldTypeUrl( type, \"map_int32_int32\", GetTypeUrl(\"proto2_unittest.TestMap.MapInt32Int32Entry\"))"
                 ,"false","true",in_R9);
      c = (AlphaNum *)local_148._0_8_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x149,(char *)local_148._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((AlphaNum *)local_148._0_8_ != (AlphaNum *)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_118 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
    }
    if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170,local_170);
    }
    pTVar2 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
             super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
             .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
    local_148._0_8_ = &DAT_00000013;
    local_148._8_8_ = "type.googleapis.com";
    local_118 = (undefined1  [8])0x1;
    local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ab429;
    local_e8.piece_._M_len = (size_t)&DAT_0000002a;
    local_e8.piece_._M_str = "proto2_unittest.TestMap.MapInt32Int32Entry";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_168,(lts_20250127 *)local_148,(AlphaNum *)local_118,&local_e8,c);
    (*pTVar2->_vptr_TypeResolver[2])(&local_b8,pTVar2,local_168,local_b0);
    local_178[0] = (internal)(local_b8 == (StatusRep *)0x1);
    local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (((ulong)local_b8 & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref(local_b8);
    }
    if ((AlphaNum *)local_168._0_8_ != pAVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    if (local_178[0] != (internal)0x0) {
      if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_170,local_170);
      }
      this_00 = (RepeatedPtrFieldBase *)(local_b0 + 0x48);
      pRVar11 = this_00;
      if ((local_b0[0x48] & 1) != 0) {
        pRVar7 = protobuf::internal::RepeatedPtrFieldBase::rep(this_00);
        pRVar11 = (RepeatedPtrFieldBase *)pRVar7->elements;
      }
      if ((local_b0[0x48] & 1) != 0) {
        pRVar7 = protobuf::internal::RepeatedPtrFieldBase::rep(this_00);
        this_00 = (RepeatedPtrFieldBase *)pRVar7->elements;
      }
      bVar12 = pRVar11 !=
               (RepeatedPtrFieldBase *)(&this_00->tagged_rep_or_elem_ + (int)local_b0._80_4_);
      if (bVar12) {
        bVar12 = true;
        do {
          pvVar3 = pRVar11->tagged_rep_or_elem_;
          puVar8 = (undefined8 *)(*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffc);
          if ((puVar8[1] == 9) && (iVar5 = bcmp((void *)*puVar8,"map_entry",9), iVar5 == 0)) {
            BoolValue::BoolValue((BoolValue *)local_148,(Arena *)0x0);
            puVar9 = *(undefined1 **)((long)pvVar3 + 0x20);
            if (puVar9 == (undefined1 *)0x0) {
              puVar9 = _Any_default_instance_;
            }
            type_url._M_str = (char *)(*(ulong *)(puVar9 + 0x20) & 0xfffffffffffffffc);
            type_url._M_len = *(size_t *)(*(ulong *)(puVar9 + 0x18) & 0xfffffffffffffffc);
            bVar4 = protobuf::internal::InternalUnpackTo
                              ((internal *)
                               ((size_t *)(*(ulong *)(puVar9 + 0x18) & 0xfffffffffffffffc))[1],
                               type_url,(ValueType *)local_148,(Message *)c);
            if ((bVar4) && (local_148[0x18] != '\0')) {
              BoolValue::~BoolValue((BoolValue *)local_148);
              break;
            }
            BoolValue::~BoolValue((BoolValue *)local_148);
          }
          pRVar11 = (RepeatedPtrFieldBase *)&pRVar11->current_size_;
          bVar12 = pRVar11 !=
                   (RepeatedPtrFieldBase *)(&this_00->tagged_rep_or_elem_ + (int)local_b0._80_4_);
        } while (bVar12);
      }
      this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_110;
      local_118[0] = bVar12;
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      __ptr_00 = local_110;
      if (!bVar12) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_148,(internal *)local_118,
                   (AssertionResult *)"HasBoolOption(type.options(), \"map_entry\", true)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_168,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                   ,0x150,(char *)local_148._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
        if ((AlphaNum *)local_148._0_8_ != (AlphaNum *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        __ptr_00 = local_110;
        if ((long *)local_e8.piece_._M_len != (long *)0x0) {
          (**(code **)(*(long *)local_e8.piece_._M_len + 8))();
          __ptr_00 = local_110;
        }
      }
      goto LAB_00bd7bb0;
    }
    testing::Message::Message((Message *)local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,local_178,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl(\"proto2_unittest.TestMap.MapInt32Int32Entry\"), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x14f,(char *)local_148._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_118);
  }
  this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_170;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
  if ((AlphaNum *)local_148._0_8_ != (AlphaNum *)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  __ptr_00 = local_170;
  if (local_118 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_118 + 8))();
    __ptr_00 = local_170;
  }
LAB_00bd7bb0:
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_01,__ptr_00);
  }
  Type::~Type((Type *)local_b0);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestMap) {
  Type type;
  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(GetTypeUrl<proto2_unittest::TestMap>(), &type)
          .ok());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_MESSAGE,
                       "map_int32_int32", 1));
  EXPECT_TRUE(CheckFieldTypeUrl(
      type, "map_int32_int32",
      GetTypeUrl("proto2_unittest.TestMap.MapInt32Int32Entry")));

  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(
              GetTypeUrl("proto2_unittest.TestMap.MapInt32Int32Entry"), &type)
          .ok());
  EXPECT_TRUE(HasBoolOption(type.options(), "map_entry", true));
}